

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  Tables *pTVar1;
  Symbol symbol;
  undefined8 uVar2;
  __type _Var3;
  FieldDescriptor FVar4;
  bool bVar5;
  int32 iVar6;
  int iVar7;
  Type TVar8;
  CppType CVar9;
  ulong uVar10;
  string *psVar11;
  long lVar12;
  int64 iVar13;
  uint64 uVar14;
  char *pcVar15;
  FieldOptions *orig_options;
  string *name;
  float fVar16;
  double dVar17;
  SubstituteArg *in_stack_fffffffffffff758;
  string *local_5f8;
  Symbol local_5e8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  SubstituteArg local_588;
  SubstituteArg local_558;
  SubstituteArg local_528;
  SubstituteArg local_4f8;
  SubstituteArg local_4c8;
  SubstituteArg local_498;
  SubstituteArg local_468;
  SubstituteArg local_438;
  SubstituteArg local_408;
  SubstituteArg local_3d8;
  string local_3a8;
  SubstituteArg local_388;
  SubstituteArg local_358;
  SubstituteArg local_328;
  SubstituteArg local_2f8;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  char *local_c8;
  char *end_pos;
  string local_b8;
  FieldDescriptorProto_Label local_98;
  FieldDescriptorProto_Type local_94;
  string local_90;
  undefined1 local_60 [8];
  string lowercase_name;
  string *full_name;
  string *scope;
  bool is_extension_local;
  FieldDescriptor *result_local;
  Descriptor *parent_local;
  FieldDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  if (parent == (Descriptor *)0x0) {
    local_5f8 = FileDescriptor::package_abi_cxx11_(this->file_);
  }
  else {
    local_5f8 = Descriptor::full_name_abi_cxx11_(parent);
  }
  lowercase_name.field_2._8_8_ = DescriptorPool::Tables::AllocateString(this->tables_,local_5f8);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    std::__cxx11::string::append(lowercase_name.field_2._8_8_,'\x01');
  }
  uVar2 = lowercase_name.field_2._8_8_;
  FieldDescriptorProto::name_abi_cxx11_(proto);
  std::__cxx11::string::append((string *)uVar2);
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  ValidateSymbolName(this,psVar11,(string *)lowercase_name.field_2._8_8_,&proto->super_Message);
  pTVar1 = this->tables_;
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,psVar11);
  *(string **)result = psVar11;
  *(undefined8 *)(result + 8) = lowercase_name.field_2._8_8_;
  *(FileDescriptor **)(result + 0x20) = this->file_;
  iVar6 = FieldDescriptorProto::number(proto);
  *(int32 *)(result + 0x28) = iVar6;
  result[0x34] = (FieldDescriptor)is_extension;
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  std::__cxx11::string::string((string *)local_60,(string *)psVar11);
  LowerString((string *)local_60);
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,psVar11);
  if (_Var3) {
    *(undefined8 *)(result + 0x10) = *(undefined8 *)result;
  }
  else {
    psVar11 = DescriptorPool::Tables::AllocateString(this->tables_,(string *)local_60);
    *(string **)(result + 0x10) = psVar11;
  }
  pTVar1 = this->tables_;
  psVar11 = FieldDescriptorProto::name_abi_cxx11_(proto);
  anon_unknown_1::ToCamelCase(&local_90,psVar11);
  psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,&local_90);
  *(string **)(result + 0x18) = psVar11;
  std::__cxx11::string::~string((string *)&local_90);
  local_94 = FieldDescriptorProto::type(proto);
  iVar7 = internal::implicit_cast<int,google::protobuf::FieldDescriptorProto_Type>(&local_94);
  *(int *)(result + 0x2c) = iVar7;
  local_98 = FieldDescriptorProto::label(proto);
  iVar7 = internal::implicit_cast<int,google::protobuf::FieldDescriptorProto_Label>(&local_98);
  *(int *)(result + 0x30) = iVar7;
  *(undefined8 *)(result + 0x38) = 0;
  *(undefined8 *)(result + 0x40) = 0;
  *(undefined8 *)(result + 0x58) = 0;
  *(undefined8 *)(result + 0x48) = 0;
  *(undefined8 *)(result + 0x50) = 0;
  FVar4 = (FieldDescriptor)FieldDescriptorProto::has_default_value(proto);
  result[0x68] = FVar4;
  bVar5 = FieldDescriptorProto::has_default_value(proto);
  if ((bVar5) && (bVar5 = FieldDescriptor::is_repeated(result), bVar5)) {
    psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Repeated fields can\'t have default values.",
               (allocator<char> *)((long)&end_pos + 7));
    AddError(this,psVar11,&proto->super_Message,DEFAULT_VALUE,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&end_pos + 7));
  }
  bVar5 = FieldDescriptorProto::has_type(proto);
  if (bVar5) {
    bVar5 = FieldDescriptorProto::has_default_value(proto);
    if (bVar5) {
      local_c8 = (char *)0x0;
      CVar9 = FieldDescriptor::cpp_type(result);
      switch(CVar9) {
      case CPPTYPE_INT32:
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        lVar12 = strtol(pcVar15,&local_c8,0);
        *(int *)(result + 0x70) = (int)lVar12;
        break;
      case CPPTYPE_INT64:
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        iVar13 = strto64(pcVar15,&local_c8,0);
        *(int64 *)(result + 0x70) = iVar13;
        break;
      case CPPTYPE_UINT32:
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        uVar10 = strtoul(pcVar15,&local_c8,0);
        *(int *)(result + 0x70) = (int)uVar10;
        break;
      case CPPTYPE_UINT64:
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        uVar14 = strtou64(pcVar15,&local_c8,0);
        *(uint64 *)(result + 0x70) = uVar14;
        break;
      case CPPTYPE_DOUBLE:
        psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
        bVar5 = std::operator==(psVar11,"inf");
        if (bVar5) {
          dVar17 = std::numeric_limits<double>::infinity();
          *(double *)(result + 0x70) = dVar17;
        }
        else {
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          bVar5 = std::operator==(psVar11,"-inf");
          if (bVar5) {
            dVar17 = std::numeric_limits<double>::infinity();
            *(double *)(result + 0x70) = -dVar17;
          }
          else {
            psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
            bVar5 = std::operator==(psVar11,"nan");
            if (bVar5) {
              dVar17 = std::numeric_limits<double>::quiet_NaN();
              *(double *)(result + 0x70) = dVar17;
            }
            else {
              FieldDescriptorProto::default_value_abi_cxx11_(proto);
              pcVar15 = (char *)std::__cxx11::string::c_str();
              dVar17 = NoLocaleStrtod(pcVar15,&local_c8);
              *(double *)(result + 0x70) = dVar17;
            }
          }
        }
        break;
      case CPPTYPE_FLOAT:
        psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
        bVar5 = std::operator==(psVar11,"inf");
        if (bVar5) {
          fVar16 = std::numeric_limits<float>::infinity();
          *(float *)(result + 0x70) = fVar16;
        }
        else {
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          bVar5 = std::operator==(psVar11,"-inf");
          if (bVar5) {
            fVar16 = std::numeric_limits<float>::infinity();
            *(float *)(result + 0x70) = -fVar16;
          }
          else {
            psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
            bVar5 = std::operator==(psVar11,"nan");
            if (bVar5) {
              fVar16 = std::numeric_limits<float>::quiet_NaN();
              *(float *)(result + 0x70) = fVar16;
            }
            else {
              FieldDescriptorProto::default_value_abi_cxx11_(proto);
              pcVar15 = (char *)std::__cxx11::string::c_str();
              dVar17 = NoLocaleStrtod(pcVar15,&local_c8);
              *(float *)(result + 0x70) = (float)dVar17;
            }
          }
        }
        break;
      case CPPTYPE_BOOL:
        psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
        bVar5 = std::operator==(psVar11,"true");
        if (bVar5) {
          result[0x70] = (FieldDescriptor)0x1;
        }
        else {
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          bVar5 = std::operator==(psVar11,"false");
          if (bVar5) {
            result[0x70] = (FieldDescriptor)0x0;
          }
          else {
            psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,"Boolean default must be true or false.",&local_e9);
            AddError(this,psVar11,&proto->super_Message,DEFAULT_VALUE,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::allocator<char>::~allocator(&local_e9);
          }
        }
        break;
      case CPPTYPE_ENUM:
        *(undefined8 *)(result + 0x70) = 0;
        break;
      case CPPTYPE_STRING:
        TVar8 = FieldDescriptor::type(result);
        if (TVar8 == TYPE_BYTES) {
          pTVar1 = this->tables_;
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          UnescapeCEscapeString(&local_110,psVar11);
          psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,&local_110);
          *(string **)(result + 0x70) = psVar11;
          std::__cxx11::string::~string((string *)&local_110);
        }
        else {
          pTVar1 = this->tables_;
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_(proto);
          psVar11 = DescriptorPool::Tables::AllocateString(pTVar1,psVar11);
          *(string **)(result + 0x70) = psVar11;
        }
        break;
      case CPPTYPE_MESSAGE:
        psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"Messages can\'t have default values.",&local_131);
        AddError(this,psVar11,&proto->super_Message,DEFAULT_VALUE,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator(&local_131);
        result[0x68] = (FieldDescriptor)0x0;
      }
      if (local_c8 != (char *)0x0) {
        FieldDescriptorProto::default_value_abi_cxx11_(proto);
        uVar10 = std::__cxx11::string::empty();
        if (((uVar10 & 1) != 0) || (*local_c8 != '\0')) {
          psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,"Couldn\'t parse default value.",&local_159);
          AddError(this,psVar11,&proto->super_Message,DEFAULT_VALUE,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
        }
      }
    }
    else {
      CVar9 = FieldDescriptor::cpp_type(result);
      switch(CVar9) {
      case CPPTYPE_INT32:
        *(undefined4 *)(result + 0x70) = 0;
        break;
      case CPPTYPE_INT64:
        *(undefined8 *)(result + 0x70) = 0;
        break;
      case CPPTYPE_UINT32:
        *(undefined4 *)(result + 0x70) = 0;
        break;
      case CPPTYPE_UINT64:
        *(undefined8 *)(result + 0x70) = 0;
        break;
      case CPPTYPE_DOUBLE:
        *(undefined8 *)(result + 0x70) = 0;
        break;
      case CPPTYPE_FLOAT:
        *(undefined4 *)(result + 0x70) = 0;
        break;
      case CPPTYPE_BOOL:
        result[0x70] = (FieldDescriptor)0x0;
        break;
      case CPPTYPE_ENUM:
        *(undefined8 *)(result + 0x70) = 0;
        break;
      case CPPTYPE_STRING:
        *(undefined1 **)(result + 0x70) = (anonymous_namespace)::kEmptyString_abi_cxx11_;
        break;
      case CPPTYPE_MESSAGE:
      }
    }
  }
  iVar7 = FieldDescriptor::number(result);
  if (iVar7 < 1) {
    psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"Field numbers must be positive integers.",&local_181);
    AddError(this,psVar11,&proto->super_Message,NUMBER,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
  }
  else if ((is_extension) || (iVar7 = FieldDescriptor::number(result), iVar7 < 0x20000000)) {
    iVar7 = FieldDescriptor::number(result);
    if ((18999 < iVar7) && (iVar7 = FieldDescriptor::number(result), iVar7 < 20000)) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
      strings::internal::SubstituteArg::SubstituteArg(&local_3d8,19000);
      strings::internal::SubstituteArg::SubstituteArg(&local_408,19999);
      strings::internal::SubstituteArg::SubstituteArg(&local_438);
      strings::internal::SubstituteArg::SubstituteArg(&local_468);
      strings::internal::SubstituteArg::SubstituteArg(&local_498);
      strings::internal::SubstituteArg::SubstituteArg(&local_4c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_4f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_528);
      strings::internal::SubstituteArg::SubstituteArg(&local_558);
      strings::internal::SubstituteArg::SubstituteArg(&local_588);
      strings::Substitute_abi_cxx11_
                (&local_3a8,
                 (strings *)
                 "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
                 ,(char *)&local_3d8,&local_408,&local_438,&local_468,&local_498,&local_4c8,
                 &local_4f8,&local_528,&local_558,&local_588,in_stack_fffffffffffff758);
      AddError(this,psVar11,&proto->super_Message,NUMBER,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
  }
  else {
    psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
    strings::internal::SubstituteArg::SubstituteArg(&local_1d8,0x1fffffff);
    strings::internal::SubstituteArg::SubstituteArg(&local_208);
    strings::internal::SubstituteArg::SubstituteArg(&local_238);
    strings::internal::SubstituteArg::SubstituteArg(&local_268);
    strings::internal::SubstituteArg::SubstituteArg(&local_298);
    strings::internal::SubstituteArg::SubstituteArg(&local_2c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_2f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_328);
    strings::internal::SubstituteArg::SubstituteArg(&local_358);
    strings::internal::SubstituteArg::SubstituteArg(&local_388);
    strings::Substitute_abi_cxx11_
              (&local_1a8,(strings *)"Field numbers cannot be greater than $0.",(char *)&local_1d8,
               &local_208,&local_238,&local_268,&local_298,&local_2c8,&local_2f8,&local_328,
               &local_358,&local_388,in_stack_fffffffffffff758);
    AddError(this,psVar11,&proto->super_Message,NUMBER,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  if (is_extension) {
    bVar5 = FieldDescriptorProto::has_extendee(proto);
    if (!bVar5) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,"FieldDescriptorProto.extendee not set for extension field.",
                 &local_5a9);
      AddError(this,psVar11,&proto->super_Message,EXTENDEE,&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::allocator<char>::~allocator(&local_5a9);
    }
    *(Descriptor **)(result + 0x40) = parent;
  }
  else {
    bVar5 = FieldDescriptorProto::has_extendee(proto);
    if (bVar5) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d0,"FieldDescriptorProto.extendee set for non-extension field.",
                 &local_5d1);
      AddError(this,psVar11,&proto->super_Message,EXTENDEE,&local_5d0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::allocator<char>::~allocator(&local_5d1);
    }
    *(Descriptor **)(result + 0x38) = parent;
  }
  bVar5 = FieldDescriptorProto::has_options(proto);
  if (bVar5) {
    orig_options = FieldDescriptorProto::options(proto);
    AllocateOptions<google::protobuf::FieldDescriptor>(this,orig_options,result);
  }
  else {
    *(undefined8 *)(result + 0x60) = 0;
  }
  psVar11 = FieldDescriptor::full_name_abi_cxx11_(result);
  name = FieldDescriptor::name_abi_cxx11_(result);
  anon_unknown_1::Symbol::Symbol(&local_5e8,result);
  symbol.field_1.descriptor = local_5e8.field_1.descriptor;
  symbol.type = local_5e8.type;
  symbol._4_4_ = local_5e8._4_4_;
  AddSymbol(this,psVar11,parent,name,&proto->super_Message,symbol);
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_         = tables_->AllocateString(proto.name());
  result->full_name_    = full_name;
  result->file_         = file_;
  result->number_       = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we already
  // allocated rather than allocate a new one.
  string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ = tables_->AllocateString(ToCamelCase(proto.name()));

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_  = static_cast<FieldDescriptor::Type>(
                     implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
                     implicit_cast<int>(proto.label()));

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = NULL;
  result->extension_scope_ = NULL;
  result->experimental_map_key_ = NULL;
  result->message_type_ = NULL;
  result->enum_type_ = NULL;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = NULL;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
            strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
            strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
            strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
            strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ = numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ = -numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ = numeric_limits<float>::quiet_NaN();
          } else  {
            result->default_value_float_ =
              NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ = numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ = -numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ = numeric_limits<double>::quiet_NaN();
          } else  {
            result->default_value_double_ =
              NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
              UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != NULL) {
        // end_pos is only set non-NULL by the parsers for numeric types, above.
        // This checks that the default was non-empty and had no extra junk
        // after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value.");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &kEmptyString;
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
               "Field numbers $0 through $1 are reserved for the protocol "
               "buffer library implementation.",
               FieldDescriptor::kFirstReservedNumber,
               FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}